

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

shared_ptr<void> __thiscall pstore::storage::address_to_pointer(storage *this,address addr)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<void> *psVar2;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<void> sVar4;
  
  psVar2 = segment_base((storage *)addr.a_,(segment_type)(in_RDX >> 0x16));
  peVar1 = (psVar2->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (psVar2->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->sat_)._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         (array<pstore::sat_entry,_65536UL> *)((long)peVar1 + (ulong)((uint)in_RDX & 0x3fffff));
    (this->file_).super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    _Var3._M_pi = extraout_RDX;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    (this->sat_)._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         (array<pstore::sat_entry,_65536UL> *)((long)peVar1 + (ulong)((uint)in_RDX & 0x3fffff));
    (this->file_).super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<void>)sVar4.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<void> address_to_pointer (address const addr) noexcept {
            return address_to_pointer_impl (*this, addr);
        }